

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::GenerateBuilderParsingCode
          (RepeatedImmutableMessageFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  char *pcVar2;
  size_t sVar3;
  string_view text;
  
  TVar1 = GetType((this->super_ImmutableMessageFieldGenerator).descriptor_);
  if (TVar1 == TYPE_GROUP) {
    pcVar2 = 
    "$type$ m =\n    input.readGroup($number$,\n        $type$.$get_parser$,\n        extensionRegistry);\n"
    ;
    sVar3 = 0x62;
  }
  else {
    pcVar2 = 
    "$type$ m =\n    input.readMessage(\n        $type$.$get_parser$,\n        extensionRegistry);\n"
    ;
    sVar3 = 0x5b;
  }
  text._M_str = pcVar2;
  text._M_len = sVar3;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutableMessageFieldGenerator).variables_,text);
  (*(this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.super_FieldGenerator.
    _vptr_FieldGenerator[0x15])
            (this,printer,"ensure$capitalized_name$IsMutable();\n$name$_.add(m);\n",
             "$name$Builder_.addMessage(m);\n");
  return;
}

Assistant:

void RepeatedImmutableMessageFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
    printer->Print(variables_,
                   "$type$ m =\n"
                   "    input.readGroup($number$,\n"
                   "        $type$.$get_parser$,\n"
                   "        extensionRegistry);\n");
  } else {
    printer->Print(variables_,
                   "$type$ m =\n"
                   "    input.readMessage(\n"
                   "        $type$.$get_parser$,\n"
                   "        extensionRegistry);\n");
  }
  PrintNestedBuilderCondition(printer,
                              "ensure$capitalized_name$IsMutable();\n"
                              "$name$_.add(m);\n",
                              "$name$Builder_.addMessage(m);\n");
}